

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PickLoadSigns.cpp
# Opt level: O0

void __thiscall wasm::PickLoadSigns::visitLocalSet(PickLoadSigns *this,LocalSet *curr)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  Load *local_20;
  Load *load;
  LocalSet *curr_local;
  PickLoadSigns *this_local;
  
  load = (Load *)curr;
  curr_local = (LocalSet *)this;
  bVar2 = LocalSet::isTee(curr);
  if ((!bVar2) &&
     (local_20 = Expression::dynCast<wasm::Load>((Expression *)(load->offset).addr),
     local_20 != (Load *)0x0)) {
    mVar1 = *(mapped_type *)&load->bytes;
    pmVar3 = std::
             unordered_map<wasm::Load_*,_unsigned_int,_std::hash<wasm::Load_*>,_std::equal_to<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>_>
             ::operator[](&this->loads,&local_20);
    *pmVar3 = mVar1;
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    if (curr->isTee()) {
      // we can't modify a tee, the value is used elsewhere
      return;
    }
    if (auto* load = curr->value->dynCast<Load>()) {
      loads[load] = curr->index;
    }
  }